

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

int refs_resize_help(refs_table_t *tbl)

{
  size_t *psVar1;
  ulong uVar2;
  uint64_t *local_40;
  uint64_t *bucket;
  int i;
  size_t part;
  refs_table_t *tbl_local;
  
  if ((tbl->refs_control & 0xf0000000) == 0) {
    tbl_local._4_4_ = 0;
  }
  else if ((tbl->refs_control & 0x80000000) == 0) {
    if (tbl->refs_resize_part < tbl->refs_resize_size >> 7) {
      LOCK();
      psVar1 = &tbl->refs_resize_part;
      uVar2 = *psVar1;
      *psVar1 = *psVar1 + 1;
      UNLOCK();
      if (uVar2 < tbl->refs_resize_size >> 7) {
        local_40 = tbl->refs_resize_table + uVar2 * 0x80;
        for (bucket._4_4_ = 0; bucket._4_4_ < 0x80; bucket._4_4_ = bucket._4_4_ + 1) {
          refs_rehash(tbl,*local_40);
          local_40 = local_40 + 1;
        }
        LOCK();
        tbl->refs_resize_done = tbl->refs_resize_done + 1;
        UNLOCK();
        tbl_local._4_4_ = 1;
      }
      else {
        tbl_local._4_4_ = 1;
      }
    }
    else {
      tbl_local._4_4_ = 1;
    }
  }
  else {
    tbl_local._4_4_ = 1;
  }
  return tbl_local._4_4_;
}

Assistant:

static int
refs_resize_help(refs_table_t *tbl)
{
    // TODO optimize??
    if (0 == (tbl->refs_control & 0xf0000000)) return 0; // no resize in progress (anymore)
    if (tbl->refs_control & 0x80000000) return 1; // still waiting for preparation

    if (tbl->refs_resize_part >= tbl->refs_resize_size / 128) return 1; // all parts claimed
    size_t part = atomic_fetch_add(&tbl->refs_resize_part, 1);
    if (part >= tbl->refs_resize_size/128) return 1; // all parts claimed

    // rehash all
    int i;
    _Atomic(uint64_t) *bucket = tbl->refs_resize_table + part * 128;
    for (i=0; i<128; i++) {
        refs_rehash(tbl, atomic_load_explicit(bucket, memory_order_relaxed));
        bucket++;
    }

    atomic_fetch_add(&tbl->refs_resize_done, 1);
    return 1;
}